

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

ArchExtKind __thiscall llvm::AArch64::parseArchExt(AArch64 *this,StringRef ArchExt)

{
  ArchExtKind AVar1;
  char *__n;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0x10;
  while( true ) {
    __n = *(char **)(&UNK_001ea078 + lVar3);
    AVar1 = *(ArchExtKind *)((long)&(anonymous_namespace)::AArch64ARCHExtNames + lVar3);
    if (__n == ArchExt.Data) {
      if (__n == (char *)0x0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(this,*(void **)(&UNK_001ea070 + lVar3),(size_t)__n);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) break;
    lVar3 = lVar3 + 0x28;
    if (lVar3 == 0x2e0) {
      return AEK_INVALID;
    }
  }
  return AVar1;
}

Assistant:

AArch64::ArchExtKind llvm::AArch64::parseArchExt(StringRef ArchExt) {
  for (const auto A : AArch64ARCHExtNames) {
    if (ArchExt == A.getName())
      return static_cast<ArchExtKind>(A.ID);
  }
  return AArch64::AEK_INVALID;
}